

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_stl_sorting(void)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  double *pdVar4;
  ostream *poVar5;
  double dVar6;
  iterator local_60;
  iterator local_58;
  iterator it;
  undefined1 local_48 [3];
  bool not_sorted;
  int last;
  sorted_ptr_arr<double> sorted_data;
  uint local_30;
  uint i;
  undefined1 local_20 [8];
  vector<double,_std::allocator<double>_> to_sort;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_20);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_20,10);
  for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
    iVar2 = rand();
    sorted_data.N = (size_t)(double)(int)(((double)iVar2 * 100.0) / 2147483647.0);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_20,
               (value_type_conflict *)&sorted_data.N);
  }
  sorted_ptr_arr<double>::sorted_ptr_arr<std::vector<double,std::allocator<double>>>
            ((sorted_ptr_arr<double> *)local_48,(vector<double,_std::allocator<double>_> *)local_20)
  ;
  pdVar4 = sorted_ptr_arr<double>::operator[]((sorted_ptr_arr<double> *)local_48,0);
  it.curr_ptr._4_4_ = (int)*pdVar4;
  it.curr_ptr._3_1_ = 0;
  local_58 = sorted_ptr_arr<double>::begin((sorted_ptr_arr<double> *)local_48);
  while( true ) {
    local_60 = sorted_ptr_arr<double>::end((sorted_ptr_arr<double> *)local_48);
    bVar1 = sorted_ptr_arr<double>::iterator::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    dVar6 = (double)it.curr_ptr._4_4_;
    pdVar4 = sorted_ptr_arr<double>::iterator::operator*(&local_58);
    if (*pdVar4 <= dVar6 && dVar6 != *pdVar4) {
      it.curr_ptr._3_1_ = 1;
    }
    pdVar4 = sorted_ptr_arr<double>::iterator::operator*(&local_58);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pdVar4);
    std::operator<<(poVar5,"\t");
    sorted_ptr_arr<double>::iterator::operator++(&local_58);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  if ((it.curr_ptr._3_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"# NOT SORTED");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  sorted_ptr_arr<double>::~sorted_ptr_arr((sorted_ptr_arr<double> *)local_48);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_20);
  return;
}

Assistant:

void test_stl_sorting() {
	srand(time(NULL));
	std::vector<double> to_sort;
	to_sort.reserve(10);
	for(unsigned int i=0; i<10; i++) {
		to_sort.push_back((int)(100*(double)rand()/(double)RAND_MAX));
	}
	
	sorted_ptr_arr<double> sorted_data(to_sort);
	int last = sorted_data[0];
	bool not_sorted = false;
	for(sorted_ptr_arr<double>::iterator it=sorted_data.begin(); it != sorted_data.end(); ++it) {
		if(last > *it) { not_sorted = true; }
		std::cout << *it << "\t";
	}
	std::cout << std::endl;
	if(not_sorted) { std::cout << "# NOT SORTED" << std::endl; }
}